

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_cell.c
# Opt level: O3

TableCell * TableCell_new(Location_conflict location,wchar_t *value)

{
  TableCell *pTVar1;
  wchar_t *pwVar2;
  
  pTVar1 = (TableCell *)malloc(0x20);
  pTVar1->cell_delete = TableCell_delete;
  pTVar1->type = Gherkin_TableCell;
  (pTVar1->location).line = location.line;
  (pTVar1->location).column = location.column;
  pTVar1->value = (wchar_t *)0x0;
  if (value != (wchar_t *)0x0) {
    pwVar2 = StringUtilities_copy_string(value);
    pTVar1->value = pwVar2;
  }
  return pTVar1;
}

Assistant:

const TableCell* TableCell_new(Location location, const wchar_t* value) {
    TableCell* table_cell  = (TableCell*)malloc(sizeof(TableCell));
    table_cell->cell_delete = (item_delete_function)TableCell_delete;
    table_cell->type = Gherkin_TableCell;
    table_cell->location.line = location.line;
    table_cell->location.column = location.column;
    table_cell->value = 0;
    if (value) {
        table_cell->value = StringUtilities_copy_string(value);
    }
    return table_cell;
}